

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O0

void __thiscall
BoxNesting::KuhnAlgorithm::KuhnAlgorithm
          (KuhnAlgorithm *this,vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *boxes)

{
  undefined1 uVar1;
  size_type sVar2;
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *in_RSI;
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  *in_RDI;
  int16_t j;
  int16_t i;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffff00;
  Box *b;
  size_type in_stack_ffffffffffffff08;
  Box *this_01;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffff10;
  undefined1 *__n;
  vector<short,_std::allocator<short>_> *this_02;
  short local_8e;
  short local_8c;
  undefined1 local_8a;
  undefined1 local_89;
  Box local_88;
  undefined2 local_5a;
  Box local_58;
  undefined2 local_2a;
  vector<short,_std::allocator<short>_> local_28;
  vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ::vector((vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
            *)0x133791);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1337a4);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x1337b7);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)0x1337ca);
  sVar2 = std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::size(local_10);
  *(short *)&in_RDI[1].
             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start = (short)sVar2;
  *(undefined2 *)
   ((long)&in_RDI[1].
           super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) =
       *(undefined2 *)
        &in_RDI[1].
         super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_2a = 0xffff;
  std::allocator<short>::allocator((allocator<short> *)0x133814);
  std::vector<short,_std::allocator<short>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (value_type_conflict4 *)in_stack_ffffffffffffff00,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  this_02 = &local_28;
  std::vector<short,_std::allocator<short>_>::operator=
            (in_stack_ffffffffffffff00,
             (vector<short,_std::allocator<short>_> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  std::vector<short,_std::allocator<short>_>::~vector(in_stack_ffffffffffffff00);
  std::allocator<short>::~allocator((allocator<short> *)0x13386a);
  local_5a = 0xffff;
  std::allocator<short>::allocator((allocator<short> *)0x133895);
  std::vector<short,_std::allocator<short>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (value_type_conflict4 *)in_stack_ffffffffffffff00,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  this_01 = &local_58;
  std::vector<short,_std::allocator<short>_>::operator=
            (in_stack_ffffffffffffff00,
             (vector<short,_std::allocator<short>_> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  std::vector<short,_std::allocator<short>_>::~vector(in_stack_ffffffffffffff00);
  std::allocator<short>::~allocator((allocator<short> *)0x1338e8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)
            (long)*(short *)&in_RDI[1].
                             super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
  local_89 = 0;
  __n = &local_8a;
  std::allocator<bool>::allocator((allocator<bool> *)0x133911);
  std::vector<bool,_std::allocator<bool>_>::vector
            (this_00,(size_type)this_01,(bool *)in_stack_ffffffffffffff00,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  b = &local_88;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)b,
             (vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x133957)
  ;
  std::allocator<bool>::~allocator((allocator<bool> *)0x133964);
  std::
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ::resize((vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
            *)this_00,(size_type)this_01);
  for (local_8c = 0;
      local_8c <
      *(short *)&in_RDI[1].
                 super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_8c = local_8c + 1) {
    std::
    vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
    ::operator[](in_RDI,(long)local_8c);
    std::vector<short,_std::allocator<short>_>::reserve(this_02,(size_type)__n);
    for (local_8e = 0;
        local_8e <
        *(short *)((long)&in_RDI[1].
                          super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 2); local_8e = local_8e + 1) {
      std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::operator[]
                (local_10,(long)local_8c);
      std::vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>::operator[]
                (local_10,(long)local_8e);
      uVar1 = Box::operator<(this_01,b);
      if ((bool)uVar1) {
        std::
        vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
        ::operator[](in_RDI,(long)local_8c);
        std::vector<short,std::allocator<short>>::emplace_back<short&>
                  ((vector<short,_std::allocator<short>_> *)b,
                   (short *)CONCAT17(uVar1,in_stack_fffffffffffffef8));
      }
    }
    std::
    vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
    ::operator[](in_RDI,(long)local_8c);
    std::vector<short,_std::allocator<short>_>::shrink_to_fit
              ((vector<short,_std::allocator<short>_> *)0x133b18);
  }
  return;
}

Assistant:

KuhnAlgorithm::KuhnAlgorithm(const std::vector<Box>& boxes)
{
	// In the boxes case left and right vertices are the same amount since
	// they are the amount of boxes
	this->leftVerticesCount = static_cast<int16_t>(boxes.size());
	this->rightVerticesCount = this->leftVerticesCount;

	this->pairsLeft = std::vector<int16_t>(this->leftVerticesCount, -1);
	this->pairsRight = std::vector<int16_t>(this->rightVerticesCount, -1);
	this->used = std::vector<bool>(this->leftVerticesCount, false);

	this->graph.resize(this->leftVerticesCount);
	for (int16_t i = 0; i < this->leftVerticesCount; ++i) {
		this->graph[i].reserve(this->rightVerticesCount);
		for (int16_t j = 0; j < this->rightVerticesCount; ++j) {
			if (boxes[i] < boxes[j]) {
				this->graph[i].emplace_back(j);
			}
		}
		this->graph[i].shrink_to_fit();
	}
}